

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceIntegrationPoints.h
# Opt level: O1

IntegrationPointList<2> *
anurbs::BrepFaceIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,BrepFace *face,double tolerance)

{
  undefined8 *puVar1;
  double *__args_2;
  element_type *peVar2;
  element_type *peVar3;
  pointer pMVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  double dVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar8;
  element_type *peVar9;
  pointer pIVar10;
  pointer pIVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar14;
  Polygon *pPVar15;
  long lVar16;
  pointer pIVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  IntegrationPointList<2> points_1;
  IntegrationPointList<2> points;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders;
  vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ders_1;
  TrimmedSurfaceClipping clipper;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_168;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> local_148;
  BrepFace *local_130;
  BrepTrim local_128;
  long local_e0;
  TrimmedSurfaceClipping local_d8;
  long local_48;
  long local_40;
  double local_38;
  
  local_d8.m_tolerance = tolerance * 10.0;
  local_d8.m_scale = tolerance / 10.0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_span_polygons.
  super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_span_trim_type.
  super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = face;
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
         &local_148,&face->m_loops);
  local_128.m_edge.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
         super__Vector_impl_data._M_finish;
  pPVar15 = (Polygon *)
            local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pMVar4 = (pPVar15->outer_path).
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (pPVar15->outer_path).
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      TrimmedSurfaceClipping::begin_loop(&local_d8);
      dVar6 = pMVar4[2].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
              m_data.array[1];
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pMVar4[3].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
               m_data.array[0];
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
      vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              *)&local_168,
             (vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
              *)((long)dVar6 + 0x10));
      pIVar10 = local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pIVar17 = local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_128.m_curve_geometry.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pPVar15;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        pIVar10 = local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pIVar17 = local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pIVar11 = local_168.
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
          pIVar10 !=
          local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
          super__Vector_impl_data._M_finish; pIVar10 = pIVar10 + 1) {
        dVar6 = (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)&pIVar10->m_t0)->
                m_storage).m_data.array[0];
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar10->m_t1;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)dVar6 + 0x30);
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this->_M_use_count = this->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this->_M_use_count = this->_M_use_count + 1;
          }
        }
        local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar17;
        BrepTrim::curve_2d(&local_128);
        TrimmedSurfaceClipping::add_curve
                  (&local_d8,
                   (CurveBase<2L> *)
                   local_128.m_loop.m_entry.
                   super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        if (local_128.m_loop.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.m_loop.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        pIVar17 = local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar11;
      }
      local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar17;
      std::vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>::
      ~vector((vector<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
               *)&local_168);
      ClipperLib::CleanPolygon
                (local_d8.m_paths.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,1.415);
      _Var12._M_pi = local_128.m_curve_geometry.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      pPVar15 = (Polygon *)(_Var12._M_pi + 1);
    } while ((Polygon *)(_Var12._M_pi + 1) !=
             (Polygon *)
             local_128.m_edge.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  }
  std::vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_>::
  ~vector((vector<anurbs::Ref<anurbs::BrepLoop>,_std::allocator<anurbs::Ref<anurbs::BrepLoop>_>_> *)
          &local_148);
  peVar8 = (local_130->m_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (local_130->m_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  peVar9 = (peVar8->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = (peVar8->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[8])(&local_148,peVar9);
  (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[9])(&local_168,peVar9);
  TrimmedSurfaceClipping::compute(&local_d8,&local_148,&local_168);
  if (local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((Polygon *)
      local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
      super__Vector_impl_data._M_start != (Polygon *)0x0) {
    operator_delete(local_148.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar13 = (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[2])(peVar9);
  local_128.m_curve_geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)CONCAT44(extraout_var,iVar13);
  iVar13 = (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(peVar9);
  local_128.m_domain.m_t0 = (double)CONCAT44(extraout_var_00,iVar13);
  local_128.m_edge.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128.m_domain.m_t0;
  if ((long)local_128.m_domain.m_t0 <
      (long)local_128.m_curve_geometry.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr) {
    local_128.m_edge.m_entry.
    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_128.m_curve_geometry.m_entry.
            super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  }
  if (local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_d8.m_spans_u.
                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_d8.m_spans_u.
                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                 super__Vector_impl_data._M_start) {
    local_128.m_edge.m_entry.
    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(((element_type *)
                     local_128.m_edge.m_entry.
                     super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->super_EntryBase)._vptr_EntryBase + 1);
    local_128.m_curve_geometry.m_entry.
    super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)&((local_128.m_curve_geometry.m_entry.
                       super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_EntryBase)._vptr_EntryBase + 1);
    local_128.m_domain.m_t0 =
         (double)((long)&(((element_type *)local_128.m_domain.m_t0)->super_EntryBase).
                         _vptr_EntryBase + 1);
    local_130 = (BrepFace *)0x0;
    __args_2 = &local_128.m_domain.m_t1;
    do {
      lVar14 = (long)local_d8.m_spans_v.
                     super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_d8.m_spans_v.
                     super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4;
      if (0 < lVar14) {
        local_48 = (long)local_130 << 4;
        lVar16 = 0;
        do {
          if (local_d8.m_span_trim_type.
              super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14 * (long)local_130 + lVar16] != Empty) {
            if (local_d8.m_span_trim_type.
                super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14 * (long)local_130 + lVar16] == Full) {
              puVar1 = (undefined8 *)
                       ((long)&(local_d8.m_spans_u.
                                super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_t0 + local_48);
              local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
              local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
              local_128.m_loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     local_d8.m_spans_v.
                     super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl
                     .super__Vector_impl_data._M_start[lVar16].m_t0;
              local_128.m_loop.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_d8.m_spans_v.
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16].m_t1;
              IntegrationPoints::get
                        ((IntegrationPointList<2> *)&local_148,
                         (size_t)local_128.m_curve_geometry.m_entry.
                                 super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(size_t)local_128.m_domain.m_t0,(Interval *)&local_168,
                         (Interval *)&local_128);
              pIVar10 = local_148.
                        super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (pPVar15 = (Polygon *)
                             local_148.
                             super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pPVar15 != (Polygon *)pIVar10; pPVar15 = (Polygon *)&pPVar15->inner_paths) {
                local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pPVar15->outer_path).
                              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(pPVar15->outer_path).
                              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                local_168.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(pPVar15->outer_path).
                              super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
                          ((int)local_168.
                                super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           local_168.
                           super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_128,peVar9,1);
                dVar6 = *(double *)
                         &((local_128.m_loop.m_entry.
                            super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_key).field_2;
                dVar19 = *(double *)
                          ((long)&((local_128.m_loop.m_entry.
                                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_key).field_2 + 8);
                peVar2 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_data).
                         super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var5 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_data).
                         super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                peVar3 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_attributes).
                         super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                p_Var7 = ((local_128.m_loop.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_attributes).
                         super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                dVar20 = dVar19 * (double)p_Var7 - (double)peVar3 * (double)peVar2;
                dVar18 = (double)peVar2 * (double)p_Var5 - (double)p_Var7 * dVar6;
                dVar6 = dVar6 * (double)peVar3 - (double)p_Var5 * dVar19;
                local_128.m_domain.m_t1 =
                     SQRT(dVar6 * dVar6 + dVar18 * dVar18 + dVar20 * dVar20) *
                     (double)local_168.
                             super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                ::emplace_back<double_const&,double_const&,double>
                          ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                            *)__return_storage_ptr__,
                           (double *)
                           &local_168.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (double *)
                           &local_168.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_finish,__args_2);
                if (local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  operator_delete(local_128.m_loop.m_entry.
                                  super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(long)local_128.m_edge.m_entry.
                                                super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr -
                                          (long)local_128.m_loop.m_entry.
                                                super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr);
                }
              }
              if ((Polygon *)
                  local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start != (Polygon *)0x0) {
                operator_delete(local_148.
                                super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_148.
                                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148.
                                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              local_40 = lVar16;
              std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::vector
                        ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&local_148,
                         local_d8.m_span_polygons.
                         super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         lVar14 * (long)local_130 + lVar16);
              local_128.m_curve_geometry.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              pPVar15 = (Polygon *)
                        local_148.
                        super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_148.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                do {
                  PolygonIntegrationPoints::get
                            ((IntegrationPointList<2> *)&local_168,
                             (Index)local_128.m_edge.m_entry.
                                    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi,pPVar15);
                  pIVar10 = local_168.
                            super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  for (pIVar17 = local_168.
                                 super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pIVar17 != pIVar10;
                      pIVar17 = (pointer)&pIVar17[1].m_t1) {
                    local_128.m_edge.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                              &pIVar17[1].m_t0)->m_storage).m_data.array[0];
                    local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             (((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                              &pIVar17->m_t0)->m_storage).m_data.array[0];
                    local_128.m_loop.m_entry.
                    super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pIVar17->m_t1;
                    (*(peVar9->super_SurfaceBase<3L>)._vptr_SurfaceBase[7])
                              ((int)local_128.m_edge.m_entry.
                                    super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,
                               local_128.m_loop.m_entry.
                               super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi,__args_2,peVar9,1);
                    dVar18 = *(double *)((long)local_128.m_domain.m_t1 + 0x20) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x40) -
                             *(double *)((long)local_128.m_domain.m_t1 + 0x38) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x28);
                    dVar19 = *(double *)((long)local_128.m_domain.m_t1 + 0x28) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x30) -
                             *(double *)((long)local_128.m_domain.m_t1 + 0x40) *
                             *(double *)((long)local_128.m_domain.m_t1 + 0x18);
                    dVar6 = *(double *)((long)local_128.m_domain.m_t1 + 0x18) *
                            *(double *)((long)local_128.m_domain.m_t1 + 0x38) -
                            *(double *)((long)local_128.m_domain.m_t1 + 0x30) *
                            *(double *)((long)local_128.m_domain.m_t1 + 0x20);
                    local_38 = SQRT(dVar6 * dVar6 + dVar19 * dVar19 + dVar18 * dVar18) *
                               (double)local_128.m_loop.m_entry.
                                       super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                    std::
                    vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                    ::emplace_back<double_const&,double_const&,double>
                              ((vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>
                                *)__return_storage_ptr__,(double *)&local_128.m_edge,
                               (double *)
                               &local_128.m_loop.m_entry.
                                super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,&local_38);
                    if ((void *)local_128.m_domain.m_t1 != (void *)0x0) {
                      operator_delete((void *)local_128.m_domain.m_t1,
                                      local_e0 - (long)local_128.m_domain.m_t1);
                    }
                  }
                  if (local_168.
                      super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_168.
                                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_168.
                                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_168.
                                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  pPVar15 = pPVar15 + 1;
                } while (pPVar15 !=
                         (Polygon *)
                         local_128.m_curve_geometry.m_entry.
                         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
              }
              std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector
                        ((vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> *)&local_148);
              lVar16 = local_40;
            }
          }
          lVar16 = lVar16 + 1;
          lVar14 = (long)local_d8.m_spans_v.
                         super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d8.m_spans_v.
                         super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
        } while (lVar16 < lVar14);
      }
      local_130 = (BrepFace *)
                  ((long)&(local_130->m_brep).m_entry.
                          super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 1);
    } while ((long)local_130 <
             (long)local_d8.m_spans_u.
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_d8.m_spans_u.
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  }
  if (local_d8.m_spans_v.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_spans_v.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.m_spans_v.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_spans_v.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.m_spans_u.super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_spans_u.
                    super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.m_spans_u.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_spans_u.
                          super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
  ::~vector(&local_d8.m_span_polygons);
  if (local_d8.m_span_trim_type.
      super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_span_trim_type.
                    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_span_trim_type.
                          super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_span_trim_type.
                          super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_d8.m_paths);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const BrepFace& face, const double tolerance)
    {
        TrimmedSurfaceClipping clipper(tolerance * 10, tolerance / 10);

        IntegrationPointList<2> integration_points;

        for (const auto loop : face.loops()) {
            clipper.begin_loop();

            for (const auto trim : loop->trims()) {
                clipper.add_curve(*trim->curve_2d());
            }

            clipper.end_loop();
        }

        const auto& surface_geometry = *face.surface_geometry().data();
        clipper.compute(surface_geometry.spans_u(), surface_geometry.spans_v());

        const auto degree_u = surface_geometry.degree_u();
        const auto degree_v = surface_geometry.degree_v();

        const auto degree = std::max(degree_u, degree_v) + 1;

        for (Index i = 0; i < clipper.nb_spans_u(); i++) {
            for (Index j = 0; j < clipper.nb_spans_v(); j++) {
                if (clipper.span_trim_type(i, j) == TrimTypes::Empty) {
                    continue;
                }

                if (clipper.span_trim_type(i, j) == TrimTypes::Full) {
                    const auto points = IntegrationPoints::get(degree_u + 1, degree_v + 1, clipper.span_u(i), clipper.span_v(j));

                    for (const auto [u, v, weight] : points) {
                        const auto ders = surface_geometry.derivatives_at(u, v, 1);

                        const auto n = cross(ders[1], ders[2]);

                        integration_points.emplace_back(u, v, weight * norm(n));
                    }
                } else {
                    const auto polygons = clipper.span_polygons(i, j);

                    for (const auto& polygon : polygons) {
                        const auto points = PolygonIntegrationPoints::get(degree, polygon);

                        for (const auto [u, v, weight] : points) {
                            const auto ders = surface_geometry.derivatives_at(u, v, 1);

                            const auto n = cross(ders[1], ders[2]);

                            integration_points.emplace_back(u, v, weight * norm(n));
                        }
                    }
                }
            }
        }

        return integration_points;
    }